

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_parse_custom_request(Curl_easy *data)

{
  IMAP *pIVar1;
  char *pcVar2;
  bool bVar3;
  char *local_30;
  char *params;
  char *custom;
  IMAP *imap;
  CURLcode result;
  Curl_easy *data_local;
  
  imap._4_4_ = CURLE_OK;
  pIVar1 = (data->req).p.imap;
  pcVar2 = (data->set).str[0x1c];
  if ((pcVar2 != (char *)0x0) &&
     (imap._4_4_ = Curl_urldecode(pcVar2,0,&pIVar1->custom,(size_t *)0x0,REJECT_CTRL),
     imap._4_4_ == CURLE_OK)) {
    local_30 = pIVar1->custom;
    while( true ) {
      bVar3 = false;
      if (*local_30 != '\0') {
        bVar3 = *local_30 != ' ';
      }
      if (!bVar3) break;
      local_30 = local_30 + 1;
    }
    if (*local_30 != '\0') {
      pcVar2 = (*Curl_cstrdup)(local_30);
      pIVar1->custom_params = pcVar2;
      pIVar1->custom[(long)local_30 - (long)pIVar1->custom] = '\0';
      if (pIVar1->custom_params == (char *)0x0) {
        imap._4_4_ = CURLE_OUT_OF_MEMORY;
      }
    }
  }
  return imap._4_4_;
}

Assistant:

static CURLcode imap_parse_custom_request(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = data->req.p.imap;
  const char *custom = data->set.str[STRING_CUSTOMREQUEST];

  if(custom) {
    /* URL decode the custom request */
    result = Curl_urldecode(custom, 0, &imap->custom, NULL, REJECT_CTRL);

    /* Extract the parameters if specified */
    if(!result) {
      const char *params = imap->custom;

      while(*params && *params != ' ')
        params++;

      if(*params) {
        imap->custom_params = strdup(params);
        imap->custom[params - imap->custom] = '\0';

        if(!imap->custom_params)
          result = CURLE_OUT_OF_MEMORY;
      }
    }
  }

  return result;
}